

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySubImage3D.cpp
# Opt level: O0

void __thiscall
glcts::TextureCubeMapArraySubImage3D::configureDataBuffer
          (TextureCubeMapArraySubImage3D *this,GLuint width,GLuint height,GLuint depth,
          SubImage3DCopyParams *copy_params,GLuint clear_value)

{
  int iVar1;
  reference pvVar2;
  int iVar3;
  uint local_5c;
  GLuint component_1;
  GLuint *data_pointer;
  uint local_48;
  GLuint xoffset_1;
  GLuint yoffset_1;
  GLuint zoffset_1;
  GLuint component;
  GLuint xoffset;
  GLuint yoffset;
  GLuint zoffset;
  GLuint index;
  GLuint clear_value_local;
  SubImage3DCopyParams *copy_params_local;
  GLuint local_18;
  GLuint depth_local;
  GLuint height_local;
  GLuint width_local;
  TextureCubeMapArraySubImage3D *this_local;
  
  yoffset = 0;
  zoffset = clear_value;
  _index = copy_params;
  copy_params_local._4_4_ = depth;
  local_18 = height;
  depth_local = width;
  _height_local = this;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::assign
            (&this->m_copy_data_buffer,
             (ulong)(copy_params->m_width * copy_params->m_height * copy_params->m_depth * 4),
             &zoffset);
  for (xoffset = _index->m_zoffset; xoffset < _index->m_zoffset + _index->m_depth;
      xoffset = xoffset + 1) {
    for (component = _index->m_yoffset; component < _index->m_yoffset + _index->m_height;
        component = component + 1) {
      for (zoffset_1 = _index->m_xoffset; zoffset_1 < _index->m_xoffset + _index->m_width;
          zoffset_1 = zoffset_1 + 1) {
        for (yoffset_1 = 0; yoffset_1 < 4; yoffset_1 = yoffset_1 + 1) {
          iVar1 = xoffset * depth_local * local_18;
          iVar3 = component * depth_local;
          pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (&this->m_copy_data_buffer,(ulong)yoffset);
          *pvVar2 = (iVar1 + iVar3 + zoffset_1) * 4 + yoffset_1;
          yoffset = yoffset + 1;
        }
      }
    }
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::assign
            (&this->m_expected_data_buffer,
             (ulong)(depth_local * local_18 * copy_params_local._4_4_ * 4),&zoffset);
  for (xoffset_1 = _index->m_zoffset; xoffset_1 < _index->m_zoffset + _index->m_depth;
      xoffset_1 = xoffset_1 + 1) {
    for (local_48 = _index->m_yoffset; local_48 < _index->m_yoffset + _index->m_height;
        local_48 = local_48 + 1) {
      for (data_pointer._4_4_ = _index->m_xoffset;
          data_pointer._4_4_ < _index->m_xoffset + _index->m_width;
          data_pointer._4_4_ = data_pointer._4_4_ + 1) {
        pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&this->m_expected_data_buffer,
                            (ulong)((xoffset_1 * depth_local * local_18 + local_48 * depth_local +
                                    data_pointer._4_4_) * 4));
        for (local_5c = 0; local_5c < 4; local_5c = local_5c + 1) {
          pvVar2[local_5c] =
               (xoffset_1 * depth_local * local_18 + local_48 * depth_local + data_pointer._4_4_) *
               4 + local_5c;
        }
      }
    }
  }
  return;
}

Assistant:

void TextureCubeMapArraySubImage3D::configureDataBuffer(glw::GLuint width, glw::GLuint height, glw::GLuint depth,
														const SubImage3DCopyParams& copy_params,
														glw::GLuint					clear_value)
{
	glw::GLuint index = 0;

	m_copy_data_buffer.assign(copy_params.m_width * copy_params.m_height * copy_params.m_depth * m_n_components,
							  clear_value);
	for (glw::GLuint zoffset = copy_params.m_zoffset; zoffset < copy_params.m_zoffset + copy_params.m_depth; ++zoffset)
	{
		for (glw::GLuint yoffset = copy_params.m_yoffset; yoffset < copy_params.m_yoffset + copy_params.m_height;
			 ++yoffset)
		{
			for (glw::GLuint xoffset = copy_params.m_xoffset; xoffset < copy_params.m_xoffset + copy_params.m_width;
				 ++xoffset)
			{
				for (glw::GLuint component = 0; component < m_n_components; ++component)
				{
					m_copy_data_buffer[index++] =
						(zoffset * width * height + yoffset * width + xoffset) * m_n_components + component;
				}
			}
		}
	}

	m_expected_data_buffer.assign(width * height * depth * m_n_components, clear_value);
	for (glw::GLuint zoffset = copy_params.m_zoffset; zoffset < copy_params.m_zoffset + copy_params.m_depth; ++zoffset)
	{
		for (glw::GLuint yoffset = copy_params.m_yoffset; yoffset < copy_params.m_yoffset + copy_params.m_height;
			 ++yoffset)
		{
			for (glw::GLuint xoffset = copy_params.m_xoffset; xoffset < copy_params.m_xoffset + copy_params.m_width;
				 ++xoffset)
			{
				glw::GLuint* data_pointer =
					&m_expected_data_buffer[(zoffset * width * height + yoffset * width + xoffset) * m_n_components];
				for (glw::GLuint component = 0; component < m_n_components; ++component)
				{
					data_pointer[component] =
						(zoffset * width * height + yoffset * width + xoffset) * m_n_components + component;
				}
			}
		}
	}
}